

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

IString __thiscall wasm::Wasm2JSBuilder::getTemp(Wasm2JSBuilder *this,Type type,Function *func)

{
  pointer *ppIVar1;
  pointer pvVar2;
  unsigned_long __val;
  bool bVar3;
  BasicType BVar4;
  IString *this_00;
  iterator iVar5;
  undefined1 reuse;
  pointer puVar6;
  char *__assertion;
  Type in_R8;
  string_view sVar7;
  Name name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Type local_40;
  Type type_local;
  
  local_40.id = type.id;
  bVar3 = wasm::Type::isTuple(&local_40);
  if (bVar3) {
    __assertion = "!type.isTuple() && \"Unexpected tuple type\"";
  }
  else {
    if (local_40.id < (char *)0x7) {
      BVar4 = wasm::Type::getBasic(&local_40);
      pvVar2 = (this->frees).
               super__Vector_base<std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::allocator<std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar2[BVar4].super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>.
                   _M_impl.super__Vector_impl_data + 8) ==
          pvVar2[BVar4].super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>._M_impl.
          super__Vector_impl_data._M_start) {
        BVar4 = wasm::Type::getBasic(&local_40);
        puVar6 = (this->temps).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        __val = puVar6[BVar4];
        puVar6[BVar4] = __val + 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"wasm2js_",(allocator<char> *)((long)&type_local.id + 7));
        reuse = SUB81(puVar6,0);
        wasm::Type::toString_abi_cxx11_(&local_a0,&local_40);
        std::operator+(&local_e0,&local_c0,&local_a0);
        std::operator+(&local_100,&local_e0,"$");
        std::__cxx11::to_string(&local_80,__val);
        std::operator+(&local_60,&local_100,&local_80);
        this_00 = (IString *)strlen(local_60._M_dataplus._M_p);
        sVar7._M_str = (char *)0x0;
        sVar7._M_len = (size_t)local_60._M_dataplus._M_p;
        sVar7 = IString::interned(this_00,sVar7,(bool)reuse);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      else {
        BVar4 = wasm::Type::getBasic(&local_40);
        sVar7 = (*(pointer *)
                  ((long)&(this->frees).
                          super__Vector_base<std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::allocator<std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[BVar4].
                          super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>._M_impl.
                          super__Vector_impl_data + 8))[-1].str;
        BVar4 = wasm::Type::getBasic(&local_40);
        ppIVar1 = (pointer *)
                  ((long)&(this->frees).
                          super__Vector_base<std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::allocator<std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[BVar4].
                          super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>._M_impl.
                          super__Vector_impl_data + 8);
        *ppIVar1 = *ppIVar1 + -1;
      }
      local_60._0_16_ = sVar7;
      iVar5 = std::
              _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(func->localIndices)._M_h,(key_type *)&local_60);
      if (iVar5.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur ==
          (__node_type *)0x0) {
        name.super_IString.str._M_str = (char *)local_40.id;
        name.super_IString.str._M_len = (size_t)sVar7._M_str;
        Builder::addVar((Builder *)func,(Function *)sVar7._M_len,name,in_R8);
      }
      return (IString)sVar7;
    }
    __assertion = "type.isBasic() && \"TODO: handle compound types\"";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                ,0xce,"IString wasm::Wasm2JSBuilder::getTemp(Type, Function *)");
}

Assistant:

IString getTemp(Type type, Function* func) {
    IString ret;
    TODO_SINGLE_COMPOUND(type);
    if (frees[type.getBasic()].size() > 0) {
      ret = frees[type.getBasic()].back();
      frees[type.getBasic()].pop_back();
    } else {
      size_t index = temps[type.getBasic()]++;
      ret = IString((std::string("wasm2js_") + type.toString() + "$" +
                     std::to_string(index))
                      .c_str(),
                    false);
    }
    if (func->localIndices.find(ret) == func->localIndices.end()) {
      Builder::addVar(func, ret, type);
    }
    return ret;
  }